

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

iterator * __thiscall
pybind11::detail::values_and_holders::begin
          (iterator *__return_storage_ptr__,values_and_holders *this)

{
  values_and_holders *this_local;
  
  iterator::iterator(__return_storage_ptr__,this->inst,this->tinfo);
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(inst, tinfo); }